

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolver.cpp
# Opt level: O2

double __thiscall
chrono::ChIterativeSolver::CheckSolution
          (ChIterativeSolver *this,ChSystemDescriptor *sysd,ChVectorDynamic<> *x)

{
  ostream *poVar1;
  RealScalar RVar2;
  ChVectorDynamic<> Zx;
  ChVectorDynamic<> b;
  ChSparseMatrix Z;
  Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> local_a8;
  void *local_98;
  undefined8 uStack_90;
  RealScalar local_88;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_80;
  SparseMatrix<double,_1,_int> local_60;
  
  local_98 = (void *)0x0;
  uStack_90 = 0;
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,0);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&local_60);
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&local_60,0);
  local_a8 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator*
                       ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)
                        &local_60.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
  ::operator-(&local_80,
              (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
               *)&local_a8,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98);
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_80);
  local_80.m_lhs.m_lhs =
       (LhsNested)
       (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_a8,(long *)&local_80);
  (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_a8,x);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_80,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a8,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98);
  local_88 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&local_80);
  std::operator<<((ostream *)&std::cout,"  Residual norm (using full matrix): ");
  poVar1 = std::ostream::_M_insert<double>(RVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"  Residual norm (using SPMV):        ");
  poVar1 = std::ostream::_M_insert<double>(local_88);
  std::endl<char,std::char_traits<char>>(poVar1);
  Eigen::internal::handmade_aligned_free(local_a8.m_lhs);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&local_60);
  Eigen::internal::handmade_aligned_free(local_98);
  return RVar2;
}

Assistant:

double ChIterativeSolver::CheckSolution(ChSystemDescriptor& sysd, const ChVectorDynamic<>& x) {
    ChVectorDynamic<> b;
    sysd.ConvertToMatrixForm(nullptr, &b);

    ChSparseMatrix Z;
    sysd.ConvertToMatrixForm(&Z, nullptr);
    double res_norm1 = (Z * x - b).norm();
    
    ChVectorDynamic<> Zx(x.size());
    sysd.SystemProduct(Zx, x);
    double res_norm2 = (Zx - b).norm();

    std::cout << "  Residual norm (using full matrix): " << res_norm1 << std::endl;
    std::cout << "  Residual norm (using SPMV):        " << res_norm2 << std::endl;

    return res_norm1;
}